

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::parse_objects_color_hex_code(Parser *this)

{
  int iVar1;
  Token<ParsedGame::ObjectsTokenType> color_hex_code;
  string color_hex_code_str;
  long *local_90;
  long local_88;
  long local_80 [2];
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  int local_48;
  string local_40;
  
  parse_word_abi_cxx11_(&local_40,this);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_40._M_dataplus._M_p,
             local_40._M_dataplus._M_p + local_40._M_string_length);
  iVar1 = this->m_line_counter;
  local_70._0_4_ = ColorHexCode;
  local_68._M_p = (pointer)&local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_90,local_88 + (long)local_90);
  local_48 = iVar1;
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  std::
  vector<Token<ParsedGame::ObjectsTokenType>,_std::allocator<Token<ParsedGame::ObjectsTokenType>_>_>
  ::push_back(&(this->m_parsed_game).objects_tokens,(value_type *)local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Parser::parse_objects_color_hex_code()
{
	//todo make a more robust parse function and detect incorrect hex codes
	string color_hex_code_str = parse_word();
	Token<ParsedGame::ObjectsTokenType> color_hex_code(ParsedGame::ObjectsTokenType::ColorHexCode, color_hex_code_str, m_line_counter);
	m_parsed_game.objects_tokens.push_back(color_hex_code);
}